

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printMemRegImm(MCInst *MI,uint OpNo,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  char *in_RDX;
  int in_ESI;
  MCInst *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  set_mem_access(in_RDI,true);
  printS16ImmOperand_Mem
            ((MCInst *)O,(uint)((ulong)in_RDI >> 0x20),
             (SStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  SStream_concat0((SStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  op = MCInst_getOperand(in_RDI,in_ESI + 1);
  uVar1 = MCOperand_getReg(op);
  if (uVar1 == 0x55) {
    SStream_concat0((SStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  }
  else {
    printOperand(MI,OpNo,O);
  }
  SStream_concat0((SStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  set_mem_access(in_RDI,false);
  return;
}

Assistant:

static void printMemRegImm(MCInst *MI, unsigned OpNo, SStream *O)
{
	set_mem_access(MI, true);

	printS16ImmOperand_Mem(MI, OpNo, O);

	SStream_concat0(O, "(");

	if (MCOperand_getReg(MCInst_getOperand(MI, OpNo + 1)) == PPC_R0)
		SStream_concat0(O, "0");
	else
		printOperand(MI, OpNo + 1, O);

	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}